

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.hh
# Opt level: O0

field<discordpp::EmbedProvider> * __thiscall
discordpp::field<discordpp::EmbedProvider>::operator=
          (field<discordpp::EmbedProvider> *this,field<discordpp::EmbedProvider> *f)

{
  bool bVar1;
  type pEVar2;
  pointer local_58;
  field<discordpp::EmbedProvider> *f_local;
  field<discordpp::EmbedProvider> *this_local;
  
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)f);
  if (bVar1) {
    local_58 = (pointer)operator_new(0x30);
    pEVar2 = std::
             unique_ptr<discordpp::EmbedProvider,_std::default_delete<discordpp::EmbedProvider>_>::
             operator*(&f->t_);
    EmbedProvider::EmbedProvider(local_58,pEVar2);
  }
  else {
    local_58 = (pointer)0x0;
  }
  std::unique_ptr<discordpp::EmbedProvider,_std::default_delete<discordpp::EmbedProvider>_>::reset
            (&this->t_,local_58);
  this->s_ = present_e;
  return this;
}

Assistant:

field<T> &operator=(const field<T> &f) {
        t_.reset(f.t_ ? new T(*f.t_) : nullptr);
        s_ = present_e;
        return *this;
    }